

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::SerializeWithCachedSizes
          (BayesianProbitRegressor_FeatureWeight *this,CodedOutputStream *output)

{
  int iVar1;
  Type *value;
  int index;
  
  if (this->featureid_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,this->featureid_,output);
  }
  iVar1 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::TypeHandler>
                        (&(this->weights_).super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteMessage(2,&value->super_MessageLite,output);
      index = index + 1;
    } while (iVar1 != index);
  }
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureWeight::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 featureId = 1;
  if (this->featureid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->featureid(), output);
  }

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight weights = 2;
  for (unsigned int i = 0, n = this->weights_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->weights(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
}